

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O1

void AString_trimFront(AString *str,char c)

{
  char *__dest;
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t __n;
  
  if (str != (AString *)0x0) {
    __dest = str->buffer;
    if (*__dest == c) {
      sVar3 = 0;
      do {
        sVar2 = str->size;
        if (str->size == sVar3) break;
        sVar2 = sVar3 + 1;
        lVar1 = sVar3 + 1;
        sVar3 = sVar2;
      } while (__dest[lVar1] == c);
    }
    else {
      sVar2 = 0;
    }
    __n = str->size - sVar2;
    str->size = __n;
    if (__n != 0) {
      memmove(__dest,__dest + sVar2,__n);
    }
    str->buffer[str->size] = '\0';
  }
  return;
}

Assistant:

ACUTILS_HD_FUNC void AString_trimFront(struct AString *str, char c)
{
    size_t trimCount = 0;
    if(str == nullptr)
        return;
    while(str->buffer[trimCount] == c && trimCount < str->size)
        ++trimCount;
    str->size -= trimCount;
    if(str->size > 0)
        memmove(str->buffer, str->buffer + trimCount, str->size);
    str->buffer[str->size] = '\0';
}